

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall
IR::BranchInstr::ReplaceTarget
          (BranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  RealCount *pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  MultiBranchInstr *this_00;
  Type pSVar5;
  LabelInstr *this_01;
  
  this_01 = this->m_branchTarget;
  if (this_01 == (LabelInstr *)0x0) {
    if (this->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
      if (!bVar3) goto LAB_004b63d5;
      *puVar4 = 0;
    }
    this_00 = AsMultiBrInstr(this);
    bVar3 = MultiBranchInstr::ReplaceTarget(this_00,oldLabelInstr,newLabelInstr);
    return bVar3;
  }
  if (this->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
    if (!bVar3) goto LAB_004b63d5;
    *puVar4 = 0;
    this_01 = this->m_branchTarget;
  }
  if (this_01 == oldLabelInstr) {
    if (this->m_isMultiBranch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
      if (!bVar3) {
LAB_004b63d5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      this_01 = this->m_branchTarget;
    }
    if (this_01 != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef(this_01,this);
    }
    if (newLabelInstr != (LabelInstr *)0x0) {
      pSVar5 = (Type)new<Memory::ArenaAllocator>
                               (0x10,(newLabelInstr->labelRefs).
                                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                     .allocator,0x364470);
      pSVar5[1].next = (Type)this;
      pSVar5->next = (newLabelInstr->labelRefs).
                     super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (newLabelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar5;
      pRVar1 = &(newLabelInstr->labelRefs).
                super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
    this->m_branchTarget = newLabelInstr;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
BranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    if (this->IsMultiBranch())
    {
        return this->AsMultiBrInstr()->ReplaceTarget(oldLabelInstr, newLabelInstr);
    }
    if (this->GetTarget() == oldLabelInstr)
    {
        this->SetTarget(newLabelInstr);
        return true;
    }
    return false;
}